

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O2

void __thiscall gui::ChatBox::handleMousePress(ChatBox *this,Button button,Vector2f *mouseParent)

{
  size_t pos;
  Vector2f mouseLocal;
  Vector2f local_20;
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  if (this->autoHide_ != false) {
    return;
  }
  local_20 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
  if (button == Left) {
    pos = findClosestLineToMouse(this,&local_20);
    updateSelection(this,pos,false);
  }
  else if (2 < (int)button) goto LAB_00174051;
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
            (&this->onClick,&this->super_Widget,&local_20);
LAB_00174051:
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMousePress,&this->super_Widget,button,&local_20);
  return;
}

Assistant:

void ChatBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    if (autoHide_) {
        return;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button == sf::Mouse::Left) {
        updateSelection(findClosestLineToMouse(mouseLocal), false);
    }
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);
}